

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi_midiplay.hpp
# Opt level: O0

void __thiscall MIDIplay::MIDIchannel::resetAllControllers121(MIDIchannel *this)

{
  MIDIchannel *this_local;
  
  this->bend = 0;
  this->bendsense_msb = this->def_bendsense_msb;
  this->bendsense_lsb = this->def_bendsense_lsb;
  updateBendSensitivity(this);
  this->expression = '\x7f';
  this->sustain = false;
  this->softPedal = false;
  this->vibrato = '\0';
  this->aftertouch = '\0';
  memset(this->noteAftertouch,0,0x80);
  this->noteAfterTouchInUse = false;
  this->vibspeed = 31.41592653;
  this->vibdepth = 0.003937007874015748;
  this->vibdelay_us = 0;
  this->portamento = 0;
  this->portamentoEnable = false;
  this->portamentoSource = -1;
  this->portamentoRate = INFINITY;
  return;
}

Assistant:

void resetAllControllers121()
        {
            bend = 0;
            bendsense_msb = def_bendsense_msb;
            bendsense_lsb = def_bendsense_lsb;
            updateBendSensitivity();
            expression = 127;
            sustain = false;
            softPedal = false;
            vibrato = 0;
            aftertouch = 0;
            std::memset(noteAftertouch, 0, 128);
            noteAfterTouchInUse = false;
            vibspeed = 2 * 3.141592653 * 5.0;
            vibdepth = 0.5 / 127;
            vibdelay_us = 0;
            portamento = 0;
            portamentoEnable = false;
            portamentoSource = -1;
            portamentoRate = HUGE_VAL;
        }